

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_analyze.cpp
# Opt level: O1

void __thiscall front::syntax::SyntaxAnalyze::gm_var_def(SyntaxAnalyze *this)

{
  long lVar1;
  variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *op2;
  int id;
  pointer pWVar2;
  _Base_ptr this_00;
  element_type *peVar3;
  pointer pcVar4;
  pointer psVar5;
  string name_00;
  string name_01;
  string name_02;
  _Base_ptr p_Var6;
  irGenerator *this_01;
  bool bVar7;
  bool bVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  ArraySymbol *this_02;
  IntSymbol *this_03;
  mapped_type *pmVar13;
  mapped_type *pmVar14;
  int *__args;
  _Base_ptr p_Var15;
  pointer psVar16;
  undefined4 uVar17;
  char *pcVar18;
  element_type *peVar19;
  byte *pbVar20;
  _Alloc_hider _Var21;
  long lVar22;
  pointer psVar23;
  SyntaxAnalyze *pSVar24;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var25;
  SharedSyPtr symbol;
  vector<unsigned_int,_std::allocator<unsigned_int>_> inits;
  vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
  init_values;
  RightVal rightvalue1;
  string addr;
  string name;
  string initPtr;
  vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
  dimensions;
  string valueName;
  RightVal rightvalue2;
  undefined1 in_stack_fffffffffffffa2c [12];
  ArraySymbol *this_04;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_05;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var26;
  undefined1 local_5b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5a8;
  byte local_598;
  SyntaxAnalyze *local_588;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_580;
  vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
  local_578;
  undefined1 local_558 [16];
  undefined1 local_548 [24];
  undefined1 local_530 [32];
  undefined1 local_510 [16];
  pointer local_500;
  undefined1 local_4f8 [16];
  _Base_ptr local_4e8;
  _Base_ptr local_4e0;
  undefined1 local_4d8 [24];
  _Base_ptr p_Stack_4c0;
  _Base_ptr local_4b8;
  value_type local_4a8;
  irGenerator *local_498;
  string local_490;
  undefined1 local_470 [32];
  undefined1 local_450 [16];
  _Alloc_hider local_440;
  undefined1 local_438 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_428;
  string local_418;
  pointer local_3f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3f0;
  _Alloc_hider local_3e0;
  undefined1 local_3d8 [16];
  _Variadic_union<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3c8;
  undefined1 local_3a8;
  _Variadic_union<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3a0;
  byte local_380;
  _Variadic_union<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_378;
  byte local_358;
  undefined1 local_350 [32];
  byte local_330;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_328 [2];
  undefined1 local_318 [16];
  _Base_ptr local_308;
  undefined1 local_2f8 [16];
  undefined1 local_2e8 [32];
  _Base_ptr local_2c8 [2];
  _Base_ptr local_2b8 [2];
  undefined1 local_2a8 [32];
  string local_288;
  string local_268;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_248;
  string local_228;
  string local_208;
  _Variadic_union<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1e8;
  byte local_1c8;
  _Variadic_union<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1c0;
  byte local_1a0;
  _Variadic_union<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_198;
  byte local_178;
  _Variadic_union<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_170;
  byte local_150;
  _Variadic_union<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_148;
  byte local_128;
  _Variadic_union<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_120;
  byte local_100;
  RightVal local_f8;
  RightVal local_d0;
  RightVal local_a8;
  undefined1 local_80 [72];
  byte local_38;
  
  local_510._8_8_ = local_4f8;
  local_500 = (pointer)0x0;
  local_4f8[0] = _S_red;
  local_4a8.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_4a8.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_4b8 = (_Base_ptr)0x0;
  local_4d8._16_8_ = (_Base_ptr)0x0;
  p_Stack_4c0 = (_Base_ptr)0x0;
  local_578.
  super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_578.
  super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_578.
  super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this_04 = (ArraySymbol *)0x0;
  this_05._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  match_one_word(this,IDENFR);
  word::Word::get_self_abi_cxx11_
            ((string *)local_5b8,
             (this->word_list->
             super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>)._M_impl.
             super__Vector_impl_data._M_start + this->matched_index);
  std::__cxx11::string::operator=((string *)(local_510 + 8),(string *)local_5b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5b8._0_8_ != &local_5a8) {
    operator_delete((void *)local_5b8._0_8_,local_5a8._M_allocated_capacity + 1);
  }
  uVar12 = this->matched_index + 1;
  pWVar2 = (this->word_list->
           super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>)._M_impl.
           super__Vector_impl_data._M_start;
  local_510._0_8_ = (ulong)(uint)local_510._4_4_ << 0x20;
  bVar7 = false;
  if (uVar12 < (ulong)(((long)(this->word_list->
                              super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)pWVar2 >> 4) *
                      -0x5555555555555555)) {
    bVar7 = word::Word::match_token(pWVar2 + uVar12,LBRACK);
  }
  if (bVar7 != false) {
    while( true ) {
      uVar12 = this->matched_index + 1;
      pWVar2 = (this->word_list->
               super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>)._M_impl.
               super__Vector_impl_data._M_start;
      local_510._0_4_ = 2;
      if (((ulong)(((long)(this->word_list->
                          super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>)
                          ._M_impl.super__Vector_impl_data._M_finish - (long)pWVar2 >> 4) *
                  -0x5555555555555555) <= uVar12) ||
         (bVar8 = word::Word::match_token(pWVar2 + uVar12,LBRACK), !bVar8)) break;
      match_one_word(this,LBRACK);
      gm_exp((SyntaxAnalyze *)local_5b8);
      _Var26._M_pi = local_4a8.
                     super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi;
      local_4a8.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_5b8._8_8_;
      local_4a8.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_5b8._0_8_;
      local_5b8._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
      local_5b8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if (_Var26._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var26._M_pi);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_5b8._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_5b8._8_8_);
      }
      std::
      vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
      ::push_back((vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
                   *)(local_4d8 + 0x10),&local_4a8);
      match_one_word(this,RBRACK);
    }
  }
  uVar12 = this->matched_index + 1;
  pWVar2 = (this->word_list->
           super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((uVar12 < (ulong)(((long)(this->word_list->
                               super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>
                               )._M_impl.super__Vector_impl_data._M_finish - (long)pWVar2 >> 4) *
                       -0x5555555555555555)) &&
     (bVar8 = word::Word::match_token(pWVar2 + uVar12,ASSIGN), bVar8)) {
    match_one_word(this,ASSIGN);
    uVar12 = this->matched_index + 1;
    pWVar2 = (this->word_list->
             super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((uVar12 < (ulong)(((long)(this->word_list->
                                 super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>
                                 )._M_impl.super__Vector_impl_data._M_finish - (long)pWVar2 >> 4) *
                         -0x5555555555555555)) &&
       (bVar8 = word::Word::match_token(pWVar2 + uVar12,LBRACE), bVar8)) {
      match_one_word(this,LBRACE);
      gm_init_val(this,&local_578,
                  (vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
                   *)(local_4d8 + 0x10),0);
      match_one_word(this,RBRACE);
    }
    else {
      gm_init_val(this,&local_578,
                  (vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
                   *)(local_4d8 + 0x10),0);
    }
  }
  local_588 = this;
  if (bVar7 == false) {
    this_03 = (IntSymbol *)operator_new(0x40);
    local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_268,local_510._8_8_,
               (undefined1 *)
               ((long)&(local_500->
                       super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>).
                       _M_ptr + local_510._8_8_));
    front::symbol::IntSymbol::IntSymbol(this_03,&local_268,this->layer_num,false,0);
    peVar19 = (element_type *)0x0;
    std::__shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>::
    reset<front::symbol::IntSymbol>
              ((__shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2> *)
               &stack0xfffffffffffffa38,this_03);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != &local_268.field_2) {
      operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
    }
    local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_288,local_510._8_8_,
               (undefined1 *)
               ((long)&(local_500->
                       super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>).
                       _M_ptr + local_510._8_8_));
    pSVar24 = local_588;
    local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    iVar10 = 0;
    irGenerator::irGenerator::ir_declare_value
              (&local_588->irGenerator,&local_288,INT,(this_04->super_Symbol).id,&local_248,Var,0);
    if (local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_248.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_248.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._M_dataplus._M_p == &local_288.field_2) goto LAB_001a2e81;
    pbVar20 = (byte *)(local_288.field_2._M_allocated_capacity + 1);
    _Var21._M_p = local_288._M_dataplus._M_p;
  }
  else {
    local_5b8._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0;
    local_5b8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_5a8._M_allocated_capacity = 0;
    this_02 = (ArraySymbol *)operator_new(0x78);
    local_2a8._0_8_ = (_Base_ptr)(local_2a8 + 0x10);
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_2a8,local_510._8_8_,
               (undefined1 *)
               ((long)&(local_500->
                       super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>).
                       _M_ptr + local_510._8_8_));
    front::symbol::IntSymbol::getHolderIntSymbol();
    front::symbol::ArraySymbol::ArraySymbol
              (this_02,(string *)local_2a8,(SharedSyPtr *)local_3d8,local_588->layer_num,false,false
              );
    pcVar18 = (char *)0x0;
    std::__shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>::
    reset<front::symbol::ArraySymbol>
              ((__shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2> *)
               &stack0xfffffffffffffa38,this_02);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3d8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3d8._8_8_);
    }
    if ((_Base_ptr)local_2a8._0_8_ != (_Base_ptr)(local_2a8 + 0x10)) {
      operator_delete((void *)local_2a8._0_8_,local_2a8._16_8_ + 1);
    }
    p_Var6 = p_Stack_4c0;
    if ((_Base_ptr)local_4d8._16_8_ != p_Stack_4c0) {
      pcVar18 = &__libc_single_threaded;
      p_Var15 = (_Base_ptr)local_4d8._16_8_;
      do {
        local_428._M_allocated_capacity = *(undefined8 *)p_Var15;
        this_00 = p_Var15->_M_parent;
        if (this_00 != (_Base_ptr)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(int *)&this_00->_M_parent = *(int *)&this_00->_M_parent + 1;
            UNLOCK();
          }
          else {
            *(int *)&this_00->_M_parent = *(int *)&this_00->_M_parent + 1;
          }
        }
        if (this_05._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (this_05._M_pi)->_M_use_count = (this_05._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (this_05._M_pi)->_M_use_count = (this_05._M_pi)->_M_use_count + 1;
          }
        }
        if (this_00 != (_Base_ptr)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(int *)&this_00->_M_parent = *(int *)&this_00->_M_parent + 1;
            UNLOCK();
          }
          else {
            *(int *)&this_00->_M_parent = *(int *)&this_00->_M_parent + 1;
          }
        }
        _Var26._M_pi = this_05._M_pi;
        local_428._8_8_ = this_00;
        std::
        vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
        ::push_back(&this_04->_dimensions,(value_type *)&local_428);
        if ((_Base_ptr)local_428._8_8_ != (_Base_ptr)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_428._8_8_);
        }
        if (this_05._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_05._M_pi);
        }
        this_05._M_pi = _Var26._M_pi;
        if (this_00 != (_Base_ptr)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
        }
        p_Var15 = (_Base_ptr)&p_Var15->_M_left;
      } while (p_Var15 != p_Var6);
    }
    psVar5 = local_578.
             super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (local_588->layer_num == local_588->_initLayerNum) {
      if (local_578.
          super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          local_578.
          super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        iVar10 = 0;
        pcVar18 = &__libc_single_threaded;
        while( true ) {
          if (this_05._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (this_05._M_pi)->_M_use_count = (this_05._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (this_05._M_pi)->_M_use_count = (this_05._M_pi)->_M_use_count + 1;
            }
          }
          _Var26._M_pi = this_05._M_pi;
          iVar11 = front::symbol::ArraySymbol::getLen(this_04);
          if (this_05._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_05._M_pi);
          }
          this_05._M_pi = _Var26._M_pi;
          if (iVar11 <= iVar10) break;
          local_558._0_8_ = local_558._0_8_ & 0xffffffff00000000;
          if (local_5b8._8_8_ == local_5a8._M_allocated_capacity) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
            _M_realloc_insert<unsigned_int>
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_5b8,
                       (iterator)local_5b8._8_8_,(uint *)local_558);
          }
          else {
            *(uint *)local_5b8._8_8_ = 0;
            local_5b8._8_8_ = local_5b8._8_8_ + 4;
          }
          iVar10 = iVar10 + 1;
        }
      }
      else {
        pcVar18 = &__libc_single_threaded;
        psVar16 = local_578.
                  super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        do {
          peVar19 = (psVar16->
                    super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>).
                    _M_ptr;
          p_Var25 = (psVar16->
                    super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>).
                    _M_refcount._M_pi;
          if (p_Var25 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var25->_M_use_count = p_Var25->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var25->_M_use_count = p_Var25->_M_use_count + 1;
            }
          }
          if (peVar19->_type == 0) {
            local_558._0_4_ = peVar19->_value;
            if (local_5b8._8_8_ != local_5a8._M_allocated_capacity) {
              *(undefined4 *)local_5b8._8_8_ = local_558._0_4_;
              goto LAB_001a2b8f;
            }
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
            _M_realloc_insert<unsigned_int>
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_5b8,
                       (iterator)local_5b8._8_8_,(uint *)local_558);
          }
          else {
            local_558._0_8_ = (ulong)(uint)local_558._4_4_ << 0x20;
            if (local_5b8._8_8_ == local_5a8._M_allocated_capacity) {
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
              _M_realloc_insert<unsigned_int>
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_5b8,
                         (iterator)local_5b8._8_8_,(uint *)local_558);
            }
            else {
              *(uint *)local_5b8._8_8_ = 0;
LAB_001a2b8f:
              local_5b8._8_8_ = local_5b8._8_8_ + 4;
            }
          }
          if (p_Var25 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var25);
          }
          psVar16 = psVar16 + 1;
        } while (psVar16 != psVar5);
      }
    }
    if (this_05._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (this_05._M_pi)->_M_use_count = (this_05._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (this_05._M_pi)->_M_use_count = (this_05._M_pi)->_M_use_count + 1;
      }
    }
    _Var26._M_pi = this_05._M_pi;
    iVar9 = front::symbol::ArraySymbol::getLen(this_04);
    iVar11 = irGenerator::TopLocalSmallArrayLength;
    if (this_05._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_05._M_pi);
    }
    peVar19 = (element_type *)CONCAT71((int7)((ulong)pcVar18 >> 8),iVar11 < iVar9);
    bVar7 = local_578.
            super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            local_578.
            super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
    local_418._M_dataplus._M_p = (pointer)&local_418.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_418,local_510._8_8_,
               (undefined1 *)
               ((long)&(local_500->
                       super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>).
                       _M_ptr + local_510._8_8_));
    id = (this_04->super_Symbol).id;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_3f0,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_5b8);
    if (_Var26._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (_Var26._M_pi)->_M_use_count = (_Var26._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (_Var26._M_pi)->_M_use_count = (_Var26._M_pi)->_M_use_count + 1;
      }
    }
    this_05._M_pi = _Var26._M_pi;
    iVar10 = front::symbol::ArraySymbol::getLen(this_04);
    irGenerator::irGenerator::ir_declare_value
              (&local_588->irGenerator,&local_418,local_510._0_4_,id,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_3f0,
               ((uint)(iVar11 < iVar9) * 2 - (uint)bVar7) + SmallInit,iVar10);
    if (_Var26._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var26._M_pi);
    }
    pSVar24 = local_588;
    if ((void *)local_3f0._M_allocated_capacity != (void *)0x0) {
      operator_delete((void *)local_3f0._M_allocated_capacity,(long)local_3e0._M_p - local_3f0._0_8_
                     );
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_418._M_dataplus._M_p != &local_418.field_2) {
      operator_delete(local_418._M_dataplus._M_p,local_418.field_2._0_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5b8._0_8_ ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) goto LAB_001a2e81;
    pbVar20 = (byte *)(local_5a8._M_allocated_capacity - local_5b8._0_8_);
    _Var21._M_p = (pointer)local_5b8._0_8_;
  }
  operator_delete(_Var21._M_p,(ulong)pbVar20);
LAB_001a2e81:
  if (local_578.
      super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_578.
      super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    local_2c8[0] = (_Base_ptr)local_2b8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_2c8,local_510._8_8_,
               (undefined1 *)
               ((long)&(local_500->
                       super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>).
                       _M_ptr + local_510._8_8_));
    peVar19 = (element_type *)&pSVar24->irGenerator;
    name_00._4_12_ = in_stack_fffffffffffffa2c;
    name_00._M_dataplus._M_p._0_4_ = iVar10;
    name_00.field_2._M_allocated_capacity = (size_type)this_04;
    name_00.field_2._8_8_ = this_05._M_pi;
    irGenerator::irGenerator::getVarName
              (&local_490,(irGenerator *)peVar19,name_00,(uint32_t)local_2c8);
    if (local_2c8[0] != (_Base_ptr)local_2b8) {
      operator_delete(local_2c8[0],(ulong)((long)&local_2b8[0]->_M_color + 1));
    }
    local_5b8._0_8_ = local_5b8._0_8_ & 0xffffffff00000000;
    local_598 = 0;
    iVar11 = (**(this_04->super_Symbol)._vptr_Symbol)();
    if (iVar11 == 2) {
      local_4e8 = (_Base_ptr)local_4d8;
      local_4e0 = (_Base_ptr)0x0;
      local_4d8[0] = _S_red;
      local_558._0_8_ = local_558._0_8_ & 0xffffffff00000000;
      local_548[0x10] = 0;
      local_470._0_4_ = 0;
      local_450[0] = 0;
      if (pSVar24->layer_num == pSVar24->_initLayerNum) {
        irGenerator::irGenerator::getNewTmpValueName_abi_cxx11_
                  ((string *)local_530,(irGenerator *)peVar19,Ptr);
        std::__cxx11::string::operator=((string *)&local_4e8,(string *)local_530);
        if ((undefined1 *)local_530._0_8_ != local_530 + 0x10) {
          operator_delete((void *)local_530._0_8_,CONCAT71(local_530._17_7_,local_530[0x10]) + 1);
        }
        local_170._0_8_ = (long)&local_170 + 0x10;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_170,local_4e8,
                   (undefined1 *)((long)&local_4e0->_M_color + (long)local_4e8));
        local_150 = 1;
        local_120._0_8_ = (long)&local_120 + 0x10;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_120,local_490._M_dataplus._M_p,
                   local_490._M_dataplus._M_p + local_490._M_string_length);
        local_100 = 1;
        irGenerator::irGenerator::ir_ref
                  ((irGenerator *)peVar19,(LeftVal *)&local_170._M_first,
                   (LeftVal *)&local_120._M_first,false);
        (*std::__detail::__variant::
          __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
          ::_S_vtable._M_arr[local_100]._M_data)
                  ((anon_class_1_0_00000001 *)local_530,
                   (variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_120._M_first);
        local_100 = 0xff;
        (*std::__detail::__variant::
          __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
          ::_S_vtable._M_arr[local_150]._M_data)
                  ((anon_class_1_0_00000001 *)local_530,
                   (variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_170._M_first);
        local_150 = 0xff;
      }
      else {
        std::__cxx11::string::_M_assign((string *)&local_4e8);
      }
      local_510._0_8_ =
           local_578.
           super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_498 = (irGenerator *)peVar19;
      if (local_578.
          super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_578.
          super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        lVar22 = 0;
        op2 = (variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)(local_80 + 0x28);
        iVar11 = 0;
        local_3f8 = local_578.
                    super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        _Var26._M_pi = this_05._M_pi;
        do {
          peVar19 = *(element_type **)
                     ((long)&(local_3f8->
                             super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>
                             )._M_ptr + lVar22 * 4);
          p_Var25 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                     ((long)&(local_3f8->
                             super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>
                             )._M_refcount._M_pi + lVar22 * 4);
          if (p_Var25 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var25->_M_use_count = p_Var25->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var25->_M_use_count = p_Var25->_M_use_count + 1;
            }
          }
          iVar9 = (**(this_04->super_Symbol)._vptr_Symbol)();
          this_05._M_pi = _Var26._M_pi;
          if (iVar9 == 2) {
            if (_Var26._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                (_Var26._M_pi)->_M_use_count = (_Var26._M_pi)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                (_Var26._M_pi)->_M_use_count = (_Var26._M_pi)->_M_use_count + 1;
              }
            }
            if (p_Var25 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                p_Var25->_M_use_count = p_Var25->_M_use_count + 1;
                UNLOCK();
              }
              else {
                p_Var25->_M_use_count = p_Var25->_M_use_count + 1;
              }
            }
            local_438._0_8_ = peVar19;
            local_438._8_8_ = p_Var25;
            std::
            vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
            ::push_back(&this_04->_values,(value_type *)local_438);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_438._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_438._8_8_);
            }
            if (_Var26._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var26._M_pi);
            }
          }
          iVar9 = *(int *)&(((_Variant_base<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&peVar19->_type)->
                           super__Move_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>).
                           super__Copy_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
                           super__Move_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
                           super__Copy_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
                           super__Variant_storage_alias<int,_int,_std::__cxx11::basic_string<char>_>
                           ._M_u;
          if (iVar9 == 1) {
            std::variant<int,int,std::__cxx11::string>::emplace<2ul,std::__cxx11::string&>
                      ((variant<int,int,std::__cxx11::string> *)local_5b8,&peVar19->_name);
LAB_001a3213:
            this_01 = local_498;
            if (iVar11 == 0) {
              local_3c8._0_8_ = (long)&local_3c8 + 0x10;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_3c8,local_4e8,
                         (undefined1 *)((long)&local_4e0->_M_color + (long)local_4e8));
              local_3a8 = 1;
              std::__detail::__variant::
              _Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::_Copy_ctor_base((_Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)&local_a8,
                                (_Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)local_5b8);
              irGenerator::irGenerator::ir_store(local_498,(LeftVal *)&local_3c8._M_first,&local_a8)
              ;
              peVar19 = (element_type *)local_530;
              (*std::__detail::__variant::
                __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
                ::_S_vtable._M_arr
                [local_a8.
                 super__Variant_base<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 .super__Move_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
                 super__Copy_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
                 super__Move_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
                 super__Copy_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
                 super__Variant_storage_alias<int,_int,_std::__cxx11::basic_string<char>_>._M_index]
                ._M_data)((anon_class_1_0_00000001 *)peVar19,&local_a8);
              local_a8.
              super__Variant_base<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              .super__Move_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
              super__Copy_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
              super__Move_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
              super__Copy_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
              super__Variant_storage_alias<int,_int,_std::__cxx11::basic_string<char>_>._M_index =
                   0xff;
              (*std::__detail::__variant::
                __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
                ::_S_vtable._M_arr[(byte)local_3a8]._M_data)
                        ((anon_class_1_0_00000001 *)peVar19,
                         (variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_3c8._M_first);
              local_3a8 = -1;
            }
            else {
              local_530._0_8_ = local_530 + 0x10;
              local_530._8_8_ = 0;
              local_530[0x10] = '\0';
              local_580 = p_Var25;
              irGenerator::irGenerator::getNewTmpValueName_abi_cxx11_
                        ((string *)local_2e8,local_498,Ptr);
              std::__cxx11::string::operator=((string *)local_530,(string *)local_2e8);
              if ((_Base_ptr)local_2e8._0_8_ != (_Base_ptr)(local_2e8 + 0x10)) {
                operator_delete((void *)local_2e8._0_8_,(ulong)(local_2e8._16_8_ + 1));
              }
              (*std::__detail::__variant::
                __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
                ::_S_vtable._M_arr[local_548[0x10]]._M_data)
                        ((anon_class_1_0_00000001 *)local_2e8,
                         (variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)local_558);
              local_558._0_4_ = (int)lVar22;
              local_548[0x10] = 0;
              std::get<0ul,int,int,std::__cxx11::string>
                        ((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)local_558);
              local_350._0_8_ = local_350 + 0x10;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_350,local_530._0_8_,
                         (pointer)(local_530._0_8_ + local_530._8_8_));
              local_330 = 1;
              local_378._0_8_ = (long)&local_378 + 0x10;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_378,local_4e8,
                         (undefined1 *)((long)&local_4e0->_M_color + (long)local_4e8));
              local_358 = 2;
              std::__detail::__variant::
              _Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::_Copy_ctor_base((_Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)op2,(_Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)local_558);
              irGenerator::irGenerator::ir_op
                        (this_01,(LeftVal *)local_350,(RightVal *)&local_378._M_first,op2,Add);
              (*std::__detail::__variant::
                __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
                ::_S_vtable._M_arr[local_38]._M_data)((anon_class_1_0_00000001 *)local_2e8,op2);
              local_38 = 0xff;
              (*std::__detail::__variant::
                __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
                ::_S_vtable._M_arr[local_358]._M_data)
                        ((anon_class_1_0_00000001 *)local_2e8,
                         (variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_378._M_first);
              p_Var25 = local_580;
              local_358 = 0xff;
              (*std::__detail::__variant::
                __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
                ::_S_vtable._M_arr[local_330]._M_data)
                        ((anon_class_1_0_00000001 *)local_2e8,
                         (variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)local_350);
              local_330 = 0xff;
              local_3a0._0_8_ = (long)&local_3a0 + 0x10;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_3a0,local_530._0_8_,
                         (pointer)(local_530._0_8_ + local_530._8_8_));
              local_380 = 1;
              peVar19 = (element_type *)local_80;
              std::__detail::__variant::
              _Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::_Copy_ctor_base((_Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)peVar19,
                                (_Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)local_5b8);
              irGenerator::irGenerator::ir_store
                        (this_01,(LeftVal *)&local_3a0._M_first,(RightVal *)peVar19);
              (*std::__detail::__variant::
                __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
                ::_S_vtable._M_arr[(byte)local_80[0x20]]._M_data)
                        ((anon_class_1_0_00000001 *)local_2e8,
                         (variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)peVar19);
              local_80[0x20] = 0xff;
              (*std::__detail::__variant::
                __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
                ::_S_vtable._M_arr[local_380]._M_data)
                        ((anon_class_1_0_00000001 *)local_2e8,
                         (variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_3a0._M_first);
              local_380 = 0xff;
              if ((undefined1 *)local_530._0_8_ != local_530 + 0x10) {
                operator_delete((void *)local_530._0_8_,
                                CONCAT71(local_530._17_7_,local_530[0x10]) + 1);
              }
            }
          }
          else if ((iVar9 == 0) && (peVar19->_value != 0)) {
            (*std::__detail::__variant::
              __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
              ::_S_vtable._M_arr[local_598]._M_data)
                      ((anon_class_1_0_00000001 *)local_530,
                       (variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_5b8);
            local_5b8._0_4_ = peVar19->_value;
            local_598 = 0;
            std::get<0ul,int,int,std::__cxx11::string>
                      ((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_5b8);
            goto LAB_001a3213;
          }
          if (p_Var25 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var25);
          }
          lVar1 = lVar22 * 4;
          iVar11 = iVar11 + -1;
          lVar22 = lVar22 + 4;
          _Var26._M_pi = this_05._M_pi;
        } while ((_Base_ptr)
                 ((long)&local_3f8[1].
                         super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr + lVar1) != (_Base_ptr)local_510._0_8_);
      }
      (*std::__detail::__variant::
        __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
        ::_S_vtable._M_arr[(byte)local_450[0]]._M_data)
                ((anon_class_1_0_00000001 *)local_530,
                 (variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_470);
      (*std::__detail::__variant::
        __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
        ::_S_vtable._M_arr[local_548[0x10]]._M_data)
                ((anon_class_1_0_00000001 *)local_470,
                 (variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_558);
      pSVar24 = local_588;
      if (local_4e8 != (_Base_ptr)local_4d8) {
        operator_delete(local_4e8,CONCAT71(local_4d8._1_7_,local_4d8[0]) + 1);
      }
    }
    else {
      peVar3 = ((local_578.
                 super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->
               super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      p_Var25 = ((local_578.
                  super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->
                super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount._M_pi;
      if (p_Var25 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var25->_M_use_count = p_Var25->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var25->_M_use_count = p_Var25->_M_use_count + 1;
        }
      }
      if (peVar3->_type == 0) {
        (*std::__detail::__variant::
          __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
          ::_S_vtable._M_arr[local_598]._M_data)
                  ((anon_class_1_0_00000001 *)local_558,
                   (variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_5b8);
        local_5b8._0_4_ = peVar3->_value;
        local_598 = 0;
        std::get<0ul,int,int,std::__cxx11::string>
                  ((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_5b8);
      }
      else {
        std::variant<int,int,std::__cxx11::string>::emplace<2ul,std::__cxx11::string&>
                  ((variant<int,int,std::__cxx11::string> *)local_5b8,&peVar3->_name);
      }
      if (pSVar24->layer_num == pSVar24->_initLayerNum) {
        local_558._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_548[0] = 0;
        local_558._0_8_ = (element_type *)local_548;
        irGenerator::irGenerator::getNewTmpValueName_abi_cxx11_
                  ((string *)local_470,(irGenerator *)peVar19,Ptr);
        std::__cxx11::string::operator=((string *)local_558,(string *)local_470);
        if ((undefined1 *)CONCAT44(local_470._4_4_,local_470._0_4_) != local_470 + 0x10) {
          operator_delete((undefined1 *)CONCAT44(local_470._4_4_,local_470._0_4_),
                          (ulong)(local_470._16_8_ + 1));
        }
        local_198._0_8_ = (long)&local_198 + 0x10;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_198,local_558._0_8_,local_558._8_8_ + local_558._0_8_);
        local_178 = 1;
        local_148._0_8_ = (long)&local_148 + 0x10;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_148,local_490._M_dataplus._M_p,
                   local_490._M_dataplus._M_p + local_490._M_string_length);
        local_128 = 1;
        irGenerator::irGenerator::ir_ref
                  ((irGenerator *)peVar19,(LeftVal *)&local_198._M_first,
                   (LeftVal *)&local_148._M_first,false);
        (*std::__detail::__variant::
          __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
          ::_S_vtable._M_arr[local_128]._M_data)
                  ((anon_class_1_0_00000001 *)local_470,
                   (variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_148._M_first);
        local_128 = 0xff;
        (*std::__detail::__variant::
          __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
          ::_S_vtable._M_arr[local_178]._M_data)
                  ((anon_class_1_0_00000001 *)local_470,
                   (variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_198._M_first);
        local_178 = 0xff;
        local_1c0._0_8_ = (long)&local_1c0 + 0x10;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1c0,local_558._0_8_,local_558._8_8_ + local_558._0_8_);
        local_1a0 = 1;
        std::__detail::__variant::
        _Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::_Copy_ctor_base((_Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&local_d0,
                          (_Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)local_5b8);
        irGenerator::irGenerator::ir_store
                  ((irGenerator *)peVar19,(LeftVal *)&local_1c0._M_first,&local_d0);
        (*std::__detail::__variant::
          __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
          ::_S_vtable._M_arr
          [local_d0.
           super__Variant_base<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           .super__Move_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
           super__Copy_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
           super__Move_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
           super__Copy_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
           super__Variant_storage_alias<int,_int,_std::__cxx11::basic_string<char>_>._M_index].
          _M_data)((anon_class_1_0_00000001 *)local_470,&local_d0);
        local_d0.
        super__Variant_base<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .super__Move_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
        super__Copy_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
        super__Move_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
        super__Copy_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
        super__Variant_storage_alias<int,_int,_std::__cxx11::basic_string<char>_>._M_index = 0xff;
        (*std::__detail::__variant::
          __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
          ::_S_vtable._M_arr[local_1a0]._M_data)
                  ((anon_class_1_0_00000001 *)local_470,
                   (variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_1c0._M_first);
        local_1a0 = 0xff;
        if ((element_type *)local_558._0_8_ != (element_type *)local_548) {
          operator_delete((void *)local_558._0_8_,CONCAT71(local_548._1_7_,local_548[0]) + 1);
        }
      }
      else {
        local_1e8._0_8_ = (long)&local_1e8 + 0x10;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1e8,local_490._M_dataplus._M_p,
                   local_490._M_dataplus._M_p + local_490._M_string_length);
        local_1c8 = 1;
        std::__detail::__variant::
        _Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::_Copy_ctor_base((_Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&local_f8,
                          (_Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)local_5b8);
        irGenerator::irGenerator::ir_assign
                  ((irGenerator *)peVar19,(LeftVal *)&local_1e8._M_first,&local_f8);
        (*std::__detail::__variant::
          __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
          ::_S_vtable._M_arr
          [local_f8.
           super__Variant_base<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           .super__Move_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
           super__Copy_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
           super__Move_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
           super__Copy_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
           super__Variant_storage_alias<int,_int,_std::__cxx11::basic_string<char>_>._M_index].
          _M_data)((anon_class_1_0_00000001 *)local_558,&local_f8);
        local_f8.
        super__Variant_base<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .super__Move_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
        super__Copy_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
        super__Move_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
        super__Copy_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
        super__Variant_storage_alias<int,_int,_std::__cxx11::basic_string<char>_>._M_index = 0xff;
        (*std::__detail::__variant::
          __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
          ::_S_vtable._M_arr[local_1c8]._M_data)
                  ((anon_class_1_0_00000001 *)local_558,
                   (variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_1e8._M_first);
        local_1c8 = 0xff;
      }
      if (p_Var25 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var25);
      }
    }
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
      ::_S_vtable._M_arr[local_598]._M_data)
              ((anon_class_1_0_00000001 *)local_558,
               (variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_5b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_490._M_dataplus._M_p != &local_490.field_2) {
      operator_delete(local_490._M_dataplus._M_p,
                      (ulong)(local_490.field_2._M_allocated_capacity + 1));
    }
  }
  uVar17 = SUB84(peVar19,0);
  if (this_05._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (this_05._M_pi)->_M_use_count = (this_05._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (this_05._M_pi)->_M_use_count = (this_05._M_pi)->_M_use_count + 1;
    }
  }
  local_450._8_8_ = this_04;
  local_440._M_p = (pointer)this_05._M_pi;
  symbolTable::SymbolTable::push_symbol(&pSVar24->symbolTable,(SharedSyPtr *)(local_450 + 8));
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_440._M_p !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_440._M_p);
  }
  if ((local_578.
       super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
       ._M_impl.super__Vector_impl_data._M_start !=
       local_578.
       super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
       ._M_impl.super__Vector_impl_data._M_finish) &&
     (local_588->layer_num == local_588->_initLayerNum)) {
    iVar11 = (**(this_04->super_Symbol)._vptr_Symbol)();
    psVar5 = local_578.
             super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (iVar11 == 2) {
      local_5b8._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
      local_5b8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_5a8._M_allocated_capacity = 0;
      if (local_578.
          super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          local_578.
          super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        bVar7 = true;
      }
      else {
        bVar7 = true;
        psVar16 = local_578.
                  super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        do {
          psVar23 = psVar16 + 1;
          peVar19 = (psVar16->
                    super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>).
                    _M_ptr;
          iVar11 = peVar19->_type;
          if (iVar11 == 0) {
            __args = &peVar19->_value;
            if (local_5b8._8_8_ == local_5a8._M_allocated_capacity) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        ((vector<int,std::allocator<int>> *)local_5b8,(iterator)local_5b8._8_8_,
                         __args);
            }
            else {
              *(int *)local_5b8._8_8_ = *__args;
              local_5b8._8_8_ = local_5b8._8_8_ + 4;
            }
          }
          else {
            bVar7 = false;
          }
        } while ((iVar11 == 0) && (psVar16 = psVar23, psVar23 != psVar5));
      }
      if (bVar7) {
        local_558._0_8_ = 0;
        local_558._8_8_ = operator_new(0x30);
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_558._8_8_)->_M_use_count = 1;
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_558._8_8_)->_M_weak_count = 1;
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_558._8_8_)->_vptr__Sp_counted_base =
             (_func_int **)&PTR___Sp_counted_ptr_inplace_001efcd0;
        local_558._0_8_ = local_558._8_8_ + 0x10;
        *(undefined1 *)
         &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_558._8_8_ + 0x10))->
          _vptr__Sp_counted_base = 0;
        *(bool *)((long)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_558._8_8_ + 0x10))
                         ->_vptr__Sp_counted_base + 1) = bVar7;
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_558._8_8_ + 0x10))->_M_use_count = 0
        ;
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_558._8_8_ + 0x10))->_M_weak_count =
             0;
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_558._8_8_ + 0x20))->
        _vptr__Sp_counted_base = (_func_int **)0x0;
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_558._8_8_ + 0x20))->_M_use_count = 0
        ;
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_558._8_8_ + 0x20))->_M_weak_count =
             0;
        std::vector<int,std::allocator<int>>::
        _M_assign_aux<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                  ((vector<int,std::allocator<int>> *)
                   &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_558._8_8_ + 0x10))->
                    _M_use_count,local_5b8._0_8_,local_5b8._8_8_);
        pSVar24 = local_588;
        pcVar4 = (this_04->super_Symbol)._name._M_dataplus._M_p;
        local_308 = (_Base_ptr)local_2f8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)(local_318 + 0x10),pcVar4,
                   pcVar4 + (this_04->super_Symbol)._name._M_string_length);
        name_01._4_12_ = in_stack_fffffffffffffa2c;
        name_01._M_dataplus._M_p._0_4_ = iVar10;
        name_01.field_2._M_allocated_capacity = (size_type)this_04;
        name_01.field_2._8_8_ = this_05._M_pi;
        irGenerator::irGenerator::getVarName
                  (&local_208,&pSVar24->irGenerator,name_01,(int)local_318 + 0x10);
        pmVar13 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<front::optimization::bmir_variable_table::VarArray>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<front::optimization::bmir_variable_table::VarArray>_>_>_>
                  ::operator[](&(pSVar24->bmirVariableTable).name2VarArray,&local_208);
        (pmVar13->
        super___shared_ptr<front::optimization::bmir_variable_table::VarArray,_(__gnu_cxx::_Lock_policy)2>
        )._M_ptr = (element_type *)local_558._0_8_;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  (&(pmVar13->
                    super___shared_ptr<front::optimization::bmir_variable_table::VarArray,_(__gnu_cxx::_Lock_policy)2>
                    )._M_refcount,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_558 + 8));
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_dataplus._M_p != &local_208.field_2) {
          operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
        }
        if (local_308 != (_Base_ptr)local_2f8) {
          operator_delete(local_308,local_2f8._0_8_ + 1);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_558._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_558._8_8_);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5b8._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete((void *)local_5b8._0_8_,local_5a8._M_allocated_capacity - local_5b8._0_8_);
      }
    }
    else {
      iVar11 = (**(this_04->super_Symbol)._vptr_Symbol)();
      if (iVar11 == 0) {
        if (local_578.
            super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            local_578.
            super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          bVar7 = true;
        }
        else {
          bVar7 = true;
          psVar5 = local_578.
                   super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          do {
            psVar16 = psVar5 + 1;
            peVar3 = (psVar5->
                     super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr;
            iVar11 = peVar3->_type;
            if (iVar11 == 0) {
              peVar19 = (element_type *)(ulong)(uint)peVar3->_value;
            }
            else {
              bVar7 = false;
            }
            uVar17 = SUB84(peVar19,0);
          } while ((iVar11 == 0) &&
                  (psVar5 = psVar16,
                  psVar16 !=
                  local_578.
                  super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish));
        }
        if (bVar7) {
          local_5b8._0_8_ = (pointer)0x0;
          local_5b8._8_8_ = operator_new(0x18);
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_5b8._8_8_)->_M_use_count = 1;
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_5b8._8_8_)->_M_weak_count = 1;
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_5b8._8_8_)->_vptr__Sp_counted_base
               = (_func_int **)&PTR___Sp_counted_ptr_inplace_001efd20;
          local_5b8._0_8_ = local_5b8._8_8_ + 0x10;
          *(undefined1 *)
           &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_5b8._8_8_ + 0x10))->
            _vptr__Sp_counted_base = 0;
          *(bool *)((long)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_5b8._8_8_ + 0x10)
                           )->_vptr__Sp_counted_base + 1) = bVar7;
          *(undefined4 *)
           ((long)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_5b8._8_8_ + 0x10))->
                   _vptr__Sp_counted_base + 4) = uVar17;
          pcVar4 = (this_04->super_Symbol)._name._M_dataplus._M_p;
          local_328[0] = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_318;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_328,pcVar4,
                     pcVar4 + (this_04->super_Symbol)._name._M_string_length);
          pSVar24 = local_588;
          name_02._4_12_ = in_stack_fffffffffffffa2c;
          name_02._M_dataplus._M_p._0_4_ = iVar10;
          name_02.field_2._M_allocated_capacity = (size_type)this_04;
          name_02.field_2._8_8_ = this_05._M_pi;
          irGenerator::irGenerator::getVarName
                    (&local_228,&local_588->irGenerator,name_02,(uint32_t)local_328);
          pmVar14 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<front::optimization::bmir_variable_table::VarSingle>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<front::optimization::bmir_variable_table::VarSingle>_>_>_>
                    ::operator[](&(pSVar24->bmirVariableTable).name2VarSingle,&local_228);
          (pmVar14->
          super___shared_ptr<front::optimization::bmir_variable_table::VarSingle,_(__gnu_cxx::_Lock_policy)2>
          )._M_ptr = (element_type *)local_5b8._0_8_;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                    (&(pmVar14->
                      super___shared_ptr<front::optimization::bmir_variable_table::VarSingle,_(__gnu_cxx::_Lock_policy)2>
                      )._M_refcount,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_5b8 + 8));
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_228._M_dataplus._M_p != &local_228.field_2) {
            operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
          }
          if (local_328[0] !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_318) {
            operator_delete(local_328[0],(ulong)((long)(_Rb_tree_color *)local_318._0_8_ + 1));
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_5b8._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_5b8._8_8_);
          }
        }
      }
    }
  }
  if (this_05._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_05._M_pi);
  }
  std::
  vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
  ::~vector(&local_578);
  std::
  vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
  ::~vector((vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
             *)(local_4d8 + 0x10));
  if (local_4a8.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_4a8.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if ((undefined1 *)local_510._8_8_ != local_4f8) {
    operator_delete((void *)local_510._8_8_,CONCAT71(local_4f8._1_7_,local_4f8[0]) + 1);
  }
  return;
}

Assistant:

void SyntaxAnalyze::gm_var_def() {
  string name;
  SymbolKind kind;
  SharedExNdPtr dimension;
  vector<SharedExNdPtr> dimensions;
  vector<SharedExNdPtr> init_values;
  SharedSyPtr symbol;
  irGenerator::localArrayInitType initType;

  match_one_word(Token::IDENFR);
  name = get_least_matched_word().get_self();

  if (try_word(1, Token::LBRACK)) {
    kind = SymbolKind::Array;
    while (try_word(1, Token::LBRACK)) {
      match_one_word(Token::LBRACK);
      dimension = gm_const_exp();
      dimensions.push_back(dimension);
      match_one_word(Token::RBRACK);
    }
  } else {
    kind = SymbolKind::INT;
  }

  if (try_word(1, Token::ASSIGN)) {
    match_one_word(Token::ASSIGN);
    if (try_word(1, Token::LBRACE)) {
      match_one_word(Token::LBRACE);
      gm_init_val(init_values, dimensions, 0);
      match_one_word(Token::RBRACE);
    } else {
      gm_init_val(init_values, dimensions, 0);
    }
  }

  if (kind == SymbolKind::INT) {
    symbol.reset(new IntSymbol(name, layer_num, false));
    irGenerator.ir_declare_value(name, kind, symbol->getId(), {});
  } else {
    vector<uint32_t> inits;

    symbol.reset(new ArraySymbol(name, IntSymbol::getHolderIntSymbol(),
                                 layer_num, false, false));
    for (auto var : dimensions) {
      std::static_pointer_cast<ArraySymbol>(symbol)->addDimension(var);
    }

    if (inGlobalLayer()) {
      if (init_values.empty()) {
        for (int i = 0;
             i < std::static_pointer_cast<ArraySymbol>(symbol)->getLen(); i++) {
          inits.push_back(0);
        }
      } else {
        for (auto value : init_values) {
          if (value->_type == NodeType::CNS) {
            inits.push_back(value->_value);
          } else {
            inits.push_back(0);
          }
        }
      }
    }

    if (std::static_pointer_cast<ArraySymbol>(symbol)->getLen() <=
        irGenerator::TopLocalSmallArrayLength) {
      if (!init_values.empty()) {
        initType = irGenerator::localArrayInitType::SmallInit;
      } else {
        initType = irGenerator::localArrayInitType::Small;
      }
    } else {
      if (!init_values.empty()) {
        initType = irGenerator::localArrayInitType::BigInit;
      } else {
        initType = irGenerator::localArrayInitType::BigNoInit;
      }
    }

    irGenerator.ir_declare_value(
        name, kind, symbol->getId(), inits, initType,
        std::static_pointer_cast<ArraySymbol>(symbol)->getLen());
  }

  if (init_values.size() > 0) {
    string valueName = irGenerator.getVarName(name, symbol->getId());
    irGenerator::RightVal rightVal;

    if (symbol->kind() == SymbolKind::Array) {
      string initPtr;
      bool needAssgin;
      int offset = 0;
      RightVal rightvalue1;
      RightVal rightvalue2;

      if (inGlobalLayer()) {
        initPtr = irGenerator.getNewTmpValueName(TyKind::Ptr);
        irGenerator.ir_ref(initPtr, valueName);
      } else {
        initPtr = valueName;
      }

      for (auto var : init_values) {
        needAssgin = false;
        if (symbol->kind() == SymbolKind::Array) {
          std::static_pointer_cast<ArraySymbol>(symbol)->addValue(var);
        }

        if (var->_type == NodeType::CNS && var->_value != 0) {
          rightVal.emplace<0>(var->_value);
          needAssgin = true;
        } else if (var->_type == NodeType::VAR) {
          rightVal.emplace<2>(var->_name);
          needAssgin = true;
        }

        if (needAssgin) {
          if (offset > 0) {
            string addr;

            addr = irGenerator.getNewTmpValueName(mir::types::TyKind::Ptr);
            rightvalue1.emplace<0>(offset * mir::types::INT_SIZE);
            irGenerator.ir_op(addr, initPtr, rightvalue1, Op::Add);
            irGenerator.ir_store(addr, rightVal);
          } else {
            irGenerator.ir_store(initPtr, rightVal);
          }
        }
        offset++;
      }
    } else {
      SharedExNdPtr var = init_values.front();

      if (var->_type == NodeType::CNS) {
        rightVal.emplace<0>(var->_value);
      } else {
        rightVal.emplace<2>(var->_name);
      }

      if (inGlobalLayer()) {
        string addrTmp;

        addrTmp = irGenerator.getNewTmpValueName(TyKind::Ptr);
        irGenerator.ir_ref(addrTmp, valueName);
        irGenerator.ir_store(addrTmp, rightVal);
      } else {
        irGenerator.ir_assign(valueName, rightVal);
      }
    }
  }
  symbolTable.push_symbol(symbol);

  if (!init_values.empty()) {
    if (inGlobalLayer()) {
      if (symbol->kind() == SymbolKind::Array) {
        bool isConst = true;
        std::vector<int32_t> constValues;

        for (auto &value : init_values) {
          if (value->_type == NodeType::CNS) {
            constValues.push_back(value->_value);
          } else {
            isConst = false;
            break;
          }
        }

        if (isConst) {
          std::shared_ptr<optimization::bmir_variable_table::VarArray>
              varArray =
                  std::make_shared<optimization::bmir_variable_table::VarArray>(
                      isConst);

          varArray->initValues.assign(constValues.begin(), constValues.end());
          bmirVariableTable.insertVarArray(
              irGenerator.getVarName(symbol->getName(), symbol->getId()),
              varArray);
        }
      } else if (symbol->kind() == SymbolKind::INT) {
        bool isConst = true;
        int32_t constValue;

        for (auto &value : init_values) {
          if (value->_type == NodeType::CNS) {
            constValue = value->_value;
          } else {
            isConst = false;
            break;
          }
        }

        if (isConst) {
          std::shared_ptr<optimization::bmir_variable_table::VarSingle>
              varSingle = std::make_shared<
                  optimization::bmir_variable_table::VarSingle>(isConst);

          varSingle->initValue = constValue;
          bmirVariableTable.insertVarSingle(
              irGenerator.getVarName(symbol->getName(), symbol->getId()),
              varSingle);
        }
      }
    }
  }
}